

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_recoverable_signature_parse_compact
              (secp256k1_context *ctx,secp256k1_ecdsa_recoverable_signature *sig,uchar *input64,
              int recid)

{
  bool local_79;
  int local_78;
  uint local_74;
  int overflow;
  int ret;
  secp256k1_scalar s;
  secp256k1_scalar r;
  int recid_local;
  uchar *input64_local;
  secp256k1_ecdsa_recoverable_signature *sig_local;
  secp256k1_context *ctx_local;
  
  local_74 = 1;
  local_78 = 0;
  if (sig == (secp256k1_ecdsa_recoverable_signature *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"sig != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (input64 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"input64 != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    local_79 = (uint)recid < 4;
    if (local_79) {
      secp256k1_scalar_set_b32((secp256k1_scalar *)(s.d + 3),input64,&local_78);
      local_74 = ((local_78 != 0 ^ 0xffU) & 1) & local_74;
      secp256k1_scalar_set_b32((secp256k1_scalar *)&overflow,input64 + 0x20,&local_78);
      local_74 = ((local_78 != 0 ^ 0xffU) & 1) & local_74;
      if (local_74 == 0) {
        memset(sig,0,0x41);
      }
      else {
        secp256k1_ecdsa_recoverable_signature_save
                  (sig,(secp256k1_scalar *)(s.d + 3),(secp256k1_scalar *)&overflow,recid);
      }
      ctx_local._4_4_ = local_74;
    }
    else {
      secp256k1_callback_call(&ctx->illegal_callback,"recid >= 0 && recid <= 3");
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ecdsa_recoverable_signature_parse_compact(const secp256k1_context* ctx, secp256k1_ecdsa_recoverable_signature* sig, const unsigned char *input64, int recid) {
    secp256k1_scalar r, s;
    int ret = 1;
    int overflow = 0;

    (void)ctx;
    ARG_CHECK(sig != NULL);
    ARG_CHECK(input64 != NULL);
    ARG_CHECK(recid >= 0 && recid <= 3);

    secp256k1_scalar_set_b32(&r, &input64[0], &overflow);
    ret &= !overflow;
    secp256k1_scalar_set_b32(&s, &input64[32], &overflow);
    ret &= !overflow;
    if (ret) {
        secp256k1_ecdsa_recoverable_signature_save(sig, &r, &s, recid);
    } else {
        memset(sig, 0, sizeof(*sig));
    }
    return ret;
}